

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::KdTreeAggregate::Intersect(KdTreeAggregate *this,Ray *ray,Float rayTMax)

{
  Vector3f d;
  Point3f o;
  bool bVar1;
  int iVar2;
  float *pfVar3;
  const_reference pvVar4;
  ShapeIntersection *pSVar5;
  Tuple3<pbrt::Point3,_float> *in_RDX;
  undefined8 in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  long *in_FS_OFFSET;
  float in_XMM0_Da;
  Float FVar6;
  float fVar7;
  optional<pbrt::ShapeIntersection> primSi_1;
  Primitive *p_1;
  int index;
  int i;
  optional<pbrt::ShapeIntersection> primSi;
  Primitive *p;
  int nPrimitives;
  int belowFirst;
  KdTreeNode *secondChild;
  KdTreeNode *firstChild;
  Float tSplit;
  int axis;
  KdTreeNode *node;
  int nodesVisited;
  int toVisitIndex;
  KdNodeToVisit toVisit [64];
  int maxToVisit;
  Vector3f invDir;
  Float tMax;
  Float tMin;
  optional<pbrt::ShapeIntersection> *si;
  undefined8 in_stack_fffffffffffff888;
  undefined7 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff897;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  Primitive *in_stack_fffffffffffff8a8;
  Float *in_stack_fffffffffffff8b8;
  long lVar8;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  Float in_stack_fffffffffffff8cc;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  bool local_725;
  undefined4 in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  float in_stack_fffffffffffff8f4;
  optional<pbrt::ShapeIntersection> *poVar9;
  float fVar10;
  undefined4 uStack_6ec;
  optional local_6e8 [264];
  const_reference local_5e0;
  int local_5d8;
  int local_5d4;
  optional local_5d0 [264];
  const_reference local_4c8;
  int local_4c0;
  uint local_4bc;
  KdTreeNode *local_4b8;
  KdTreeNode *local_4b0;
  float local_4a4;
  int local_4a0;
  KdTreeNode *local_490;
  undefined1 local_481;
  int local_480;
  int local_47c;
  long local_478;
  float afStack_470 [256];
  undefined4 local_70;
  Tuple3<pbrt::Vector3,_float> local_6c;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Tuple3<pbrt::Point3,_float> *local_18;
  
  fVar10 = (float)in_RSI;
  uStack_6ec = (undefined4)((ulong)in_RSI >> 0x20);
  local_48 = in_RDX->z;
  local_50._0_4_ = in_RDX->x;
  local_50._4_4_ = in_RDX->y;
  local_58 = in_RDX[1].z;
  local_60._0_4_ = in_RDX[1].x;
  local_60._4_4_ = in_RDX[1].y;
  o.super_Tuple3<pbrt::Point3,_float>.z = fVar10;
  o.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_RDI;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff8f0;
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff8ec;
  d.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff8f4;
  poVar9 = in_RDI;
  local_40 = local_60;
  local_38 = local_58;
  local_30 = local_50;
  local_28 = local_48;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  bVar1 = Bounds3<float>::IntersectP
                    ((Bounds3<float> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                     ,o,d,in_stack_fffffffffffff8cc,
                     (Float *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                     in_stack_fffffffffffff8b8);
  if (bVar1) {
    Vector3<float>::Vector3
              ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (float)((ulong)in_stack_fffffffffffff888 >> 0x20),(float)in_stack_fffffffffffff888,
               0.0);
    local_70 = 0x40;
    local_47c = 0;
    local_480 = 0;
    local_481 = 0;
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
    local_490 = *(KdTreeNode **)(CONCAT44(uStack_6ec,fVar10) + 0x40);
    while ((local_490 != (KdTreeNode *)0x0 && (local_20 <= local_1c))) {
      local_480 = local_480 + 1;
      bVar1 = KdTreeNode::IsLeaf(local_490);
      if (bVar1) {
        iVar2 = KdTreeNode::nPrimitives(local_490);
        local_4c0 = iVar2;
        if (iVar2 == 1) {
          local_4c8 = std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                                ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
                                 (CONCAT44(uStack_6ec,fVar10) + 0x10),
                                 (long)(local_490->field_0).onePrimitiveIndex);
          Primitive::Intersect
                    (in_stack_fffffffffffff8a8,(Ray *)CONCAT44(iVar2,in_stack_fffffffffffff8a0),
                     (Float)((ulong)in_stack_fffffffffffff898 >> 0x20));
          bVar1 = pstd::optional::operator_cast_to_bool(local_5d0);
          in_stack_fffffffffffff8a0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8a0);
          if (bVar1) {
            pstd::optional<pbrt::ShapeIntersection>::operator=
                      ((optional<pbrt::ShapeIntersection> *)
                       CONCAT44(iVar2,in_stack_fffffffffffff8a0),in_stack_fffffffffffff898);
            in_stack_fffffffffffff898 =
                 (optional<pbrt::ShapeIntersection> *)
                 pstd::optional<pbrt::ShapeIntersection>::operator->
                           ((optional<pbrt::ShapeIntersection> *)0x7cd503);
            local_1c = *(Float *)((long)&in_stack_fffffffffffff898->optionalValue + 0xf8);
          }
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)0x7cd555);
        }
        else {
          for (local_5d4 = 0; local_5d4 < local_4c0; local_5d4 = local_5d4 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (CONCAT44(uStack_6ec,fVar10) + 0x28),
                                (long)((local_490->field_0).onePrimitiveIndex + local_5d4));
            local_5d8 = *pvVar4;
            local_5e0 = std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                                  ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)
                                   (CONCAT44(uStack_6ec,fVar10) + 0x10),(long)local_5d8);
            Primitive::Intersect
                      (in_stack_fffffffffffff8a8,(Ray *)CONCAT44(iVar2,in_stack_fffffffffffff8a0),
                       (Float)((ulong)in_stack_fffffffffffff898 >> 0x20));
            bVar1 = pstd::optional::operator_cast_to_bool(local_6e8);
            if (bVar1) {
              pstd::optional<pbrt::ShapeIntersection>::operator=
                        ((optional<pbrt::ShapeIntersection> *)
                         CONCAT44(iVar2,in_stack_fffffffffffff8a0),in_stack_fffffffffffff898);
              pSVar5 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                 ((optional<pbrt::ShapeIntersection> *)0x7cd62d);
              local_1c = pSVar5->tHit;
            }
            pstd::optional<pbrt::ShapeIntersection>::~optional
                      ((optional<pbrt::ShapeIntersection> *)0x7cd67d);
          }
        }
        if (local_47c < 1) break;
        local_47c = local_47c + -1;
        local_490 = (KdTreeNode *)(&local_478)[(long)local_47c * 2];
        local_20 = afStack_470[(long)local_47c * 4];
        local_24 = afStack_470[(long)local_47c * 4 + 1];
      }
      else {
        local_4a0 = KdTreeNode::SplitAxis(local_490);
        FVar6 = KdTreeNode::SplitPos(local_490);
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_4a0);
        pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[](&local_6c,local_4a0);
        local_4a4 = (FVar6 - fVar7) * *pfVar3;
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_4a0);
        FVar6 = KdTreeNode::SplitPos(local_490);
        local_725 = true;
        if (FVar6 <= fVar7) {
          fVar7 = Tuple3<pbrt::Point3,_float>::operator[](local_18,local_4a0);
          FVar6 = KdTreeNode::SplitPos(local_490);
          local_725 = false;
          if ((fVar7 == FVar6) && (!NAN(fVar7) && !NAN(FVar6))) {
            fVar7 = Tuple3<pbrt::Vector3,_float>::operator[]
                              ((Tuple3<pbrt::Vector3,_float> *)(local_18 + 1),local_4a0);
            local_725 = fVar7 <= 0.0;
          }
        }
        local_4bc = (uint)local_725;
        if (local_4bc == 0) {
          in_stack_fffffffffffff8a8 = *(Primitive **)(CONCAT44(uStack_6ec,fVar10) + 0x40);
          iVar2 = KdTreeNode::AboveChild(local_490);
          local_4b0 = (KdTreeNode *)(in_stack_fffffffffffff8a8 + iVar2);
          local_4b8 = local_490 + 1;
        }
        else {
          local_4b0 = local_490 + 1;
          lVar8 = *(long *)(CONCAT44(uStack_6ec,fVar10) + 0x40);
          iVar2 = KdTreeNode::AboveChild(local_490);
          local_4b8 = (KdTreeNode *)(lVar8 + (long)iVar2 * 8);
        }
        if ((local_24 < local_4a4) || (local_4a4 <= 0.0)) {
          local_490 = local_4b0;
        }
        else if (local_20 <= local_4a4) {
          (&local_478)[(long)local_47c * 2] = (long)local_4b8;
          afStack_470[(long)local_47c * 4] = local_4a4;
          afStack_470[(long)local_47c * 4 + 1] = local_24;
          local_47c = local_47c + 1;
          local_490 = local_4b0;
          local_24 = local_4a4;
        }
        else {
          local_490 = local_4b8;
        }
      }
    }
    *(long *)(*in_FS_OFFSET + -0x220) = (long)local_480 + *(long *)(*in_FS_OFFSET + -0x220);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  return poVar9;
}

Assistant:

pstd::optional<ShapeIntersection> KdTreeAggregate::Intersect(const Ray &ray,
                                                             Float rayTMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, rayTMax, &tMin, &tMax))
        return {};

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxToVisit = 64;
    KdNodeToVisit toVisit[maxToVisit];
    int toVisitIndex = 0;
    int nodesVisited = 0;

    // Traverse kd-tree nodes in order for ray
    pstd::optional<ShapeIntersection> si;
    const KdTreeNode *node = &nodes[0];
    while (node) {
        // Bail out if we found a hit closer than the current node
        if (rayTMax < tMin)
            break;

        ++nodesVisited;
        if (!node->IsLeaf()) {
            // Visit kd-tree interior node
            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node child pointers for ray
            const KdTreeNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                toVisit[toVisitIndex].node = secondChild;
                toVisit[toVisitIndex].tMin = tSplit;
                toVisit[toVisitIndex].tMax = tMax;
                ++toVisitIndex;

                node = firstChild;
                tMax = tSplit;
            }

        } else {
            // Check for intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const Primitive &p = primitives[node->onePrimitiveIndex];
                // Check one primitive inside leaf node
                pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                if (primSi) {
                    si = primSi;
                    rayTMax = si->tHit;
                }

            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int index = primitiveIndices[node->primitiveIndicesOffset + i];
                    const Primitive &p = primitives[index];
                    // Check one primitive inside leaf node
                    pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                    if (primSi) {
                        si = primSi;
                        rayTMax = si->tHit;
                    }
                }
            }

            // Grab next node to visit from todo list
            if (toVisitIndex > 0) {
                --toVisitIndex;
                node = toVisit[toVisitIndex].node;
                tMin = toVisit[toVisitIndex].tMin;
                tMax = toVisit[toVisitIndex].tMax;
            } else
                break;
        }
    }
    kdNodesVisited += nodesVisited;
    return si;
}